

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_search.cc
# Opt level: O3

void run(vw *vw_obj)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  void *pvVar2;
  ulong uVar3;
  SequenceLabelerTask task;
  vector<unsigned_int,_std::allocator<unsigned_int>_> output;
  vector<wt,_std::allocator<wt>_> data;
  wt local_168;
  SearchTask<std::vector<wt,_std::allocator<wt>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_140;
  void *local_118;
  void *pvStack_110;
  undefined8 local_108;
  vector<wt,_std::allocator<wt>_> local_f8;
  undefined1 *local_d8;
  long local_d0;
  undefined1 local_c8 [16];
  undefined1 *local_b8;
  long local_b0;
  undefined1 local_a8 [16];
  undefined1 *local_98;
  long local_90;
  undefined1 local_88 [16];
  undefined1 *local_78;
  long local_70;
  undefined1 local_68 [16];
  undefined1 *local_58;
  long local_50;
  undefined1 local_48 [16];
  undefined1 *local_38;
  long local_30;
  undefined1 local_28 [16];
  
  SequenceLabelerTask::SequenceLabelerTask((SequenceLabelerTask *)&local_140,vw_obj);
  local_f8.super__Vector_base<wt,_std::allocator<wt>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_f8.super__Vector_base<wt,_std::allocator<wt>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_f8.super__Vector_base<wt,_std::allocator<wt>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_108 = 0;
  local_118 = (void *)0x0;
  pvStack_110 = (void *)0x0;
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"the","");
  paVar1 = &local_168.word.field_2;
  local_168.word._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_168,local_38,local_38 + local_30);
  local_168.tag = 1;
  std::vector<wt,_std::allocator<wt>_>::emplace_back<wt>(&local_f8,&local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168.word._M_dataplus._M_p != paVar1) {
    operator_delete(local_168.word._M_dataplus._M_p);
  }
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"monster","");
  local_168.word._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_168,local_58,local_58 + local_50);
  local_168.tag = 2;
  std::vector<wt,_std::allocator<wt>_>::emplace_back<wt>(&local_f8,&local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168.word._M_dataplus._M_p != paVar1) {
    operator_delete(local_168.word._M_dataplus._M_p);
  }
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"ate","");
  local_168.word._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_168,local_78,local_78 + local_70);
  local_168.tag = 3;
  std::vector<wt,_std::allocator<wt>_>::emplace_back<wt>(&local_f8,&local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168.word._M_dataplus._M_p != paVar1) {
    operator_delete(local_168.word._M_dataplus._M_p);
  }
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"a","");
  local_168.word._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_168,local_98,local_98 + local_90);
  local_168.tag = 1;
  std::vector<wt,_std::allocator<wt>_>::emplace_back<wt>(&local_f8,&local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168.word._M_dataplus._M_p != paVar1) {
    operator_delete(local_168.word._M_dataplus._M_p);
  }
  if (local_98 != local_88) {
    operator_delete(local_98);
  }
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"big","");
  local_168.word._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_168,local_b8,local_b8 + local_b0);
  local_168.tag = 4;
  std::vector<wt,_std::allocator<wt>_>::emplace_back<wt>(&local_f8,&local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168.word._M_dataplus._M_p != paVar1) {
    operator_delete(local_168.word._M_dataplus._M_p);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8);
  }
  local_d8 = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"sandwich","");
  local_168.word._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_168,local_d8,local_d8 + local_d0);
  local_168.tag = 2;
  std::vector<wt,_std::allocator<wt>_>::emplace_back<wt>(&local_f8,&local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168.word._M_dataplus._M_p != paVar1) {
    operator_delete(local_168.word._M_dataplus._M_p);
  }
  if (local_d8 != local_c8) {
    operator_delete(local_d8);
  }
  (local_140.bogus_example)->test_only = false;
  pvVar2 = (local_140.sch)->task_data;
  *(vector<wt,_std::allocator<wt>_> **)((long)pvVar2 + 0x48) = &local_f8;
  *(void ***)((long)pvVar2 + 0x50) = &local_118;
  vw::learn(local_140.vw_obj,local_140.bogus_example);
  vw::learn(local_140.vw_obj,local_140.blank_line);
  (local_140.bogus_example)->test_only = false;
  pvVar2 = (local_140.sch)->task_data;
  *(vector<wt,_std::allocator<wt>_> **)((long)pvVar2 + 0x48) = &local_f8;
  *(void ***)((long)pvVar2 + 0x50) = &local_118;
  vw::learn(local_140.vw_obj,local_140.bogus_example);
  vw::learn(local_140.vw_obj,local_140.blank_line);
  (local_140.bogus_example)->test_only = false;
  pvVar2 = (local_140.sch)->task_data;
  *(vector<wt,_std::allocator<wt>_> **)((long)pvVar2 + 0x48) = &local_f8;
  *(void ***)((long)pvVar2 + 0x50) = &local_118;
  vw::learn(local_140.vw_obj,local_140.bogus_example);
  vw::learn(local_140.vw_obj,local_140.blank_line);
  (local_140.bogus_example)->test_only = true;
  pvVar2 = (local_140.sch)->task_data;
  *(vector<wt,_std::allocator<wt>_> **)((long)pvVar2 + 0x48) = &local_f8;
  *(void ***)((long)pvVar2 + 0x50) = &local_118;
  vw::learn(local_140.vw_obj,local_140.bogus_example);
  vw::learn(local_140.vw_obj,local_140.blank_line);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"output = [",10);
  if (pvStack_110 != local_118) {
    uVar3 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
      std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)((long)pvStack_110 - (long)local_118 >> 2));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ]",2);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"should have printed: 1 2 3 1 4 2",0x20);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  if (local_118 != (void *)0x0) {
    operator_delete(local_118);
  }
  std::vector<wt,_std::allocator<wt>_>::~vector(&local_f8);
  SearchTask<std::vector<wt,_std::allocator<wt>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  ::~SearchTask(&local_140);
  return;
}

Assistant:

void run(vw& vw_obj)
{ // we put this in its own scope so that its destructor on
  // SequenceLabelerTask gets called *before* VW::finish gets called;
  // otherwise we'll get a segfault :(. i'm not sure what to do about
  // this :(.
  SequenceLabelerTask task(vw_obj);
  vector<wt> data;
  vector<uint32_t> output;
  uint32_t DET = 1, NOUN = 2, VERB = 3, ADJ = 4;
  data.push_back( wt("the", DET) );
  data.push_back( wt("monster", NOUN) );
  data.push_back( wt("ate", VERB) );
  data.push_back( wt("a", DET) );
  data.push_back( wt("big", ADJ) );
  data.push_back( wt("sandwich", NOUN) );
  task.learn(data, output);
  task.learn(data, output);
  task.learn(data, output);
  task.predict(data, output);
  cerr << "output = [";
  for (size_t i=0; i<output.size(); i++) cerr << " " << output[i];
  cerr << " ]" << endl;
  cerr << "should have printed: 1 2 3 1 4 2" << endl;
}